

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall SuiteSessionTests::TestCallback::TestCallback(TestCallback *this)

{
  TestCallback *this_local;
  
  FIX::Responder::Responder(&this->super_Responder);
  FIX::NullApplication::NullApplication(&this->super_NullApplication);
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__TestCallback_0045f050;
  (this->super_NullApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__TestCallback_0045f0a0;
  FIX::UtcTimeOnly::UtcTimeOnly(&this->startTime);
  FIX::UtcTimeOnly::UtcTimeOnly(&this->endTime,&this->startTime);
  FIX::UtcTimeStamp::UtcTimeStamp(&this->startTimeStamp);
  FIX::UtcTimeStamp::UtcTimeStamp(&this->endTimeStamp);
  FIX::Message::Message(&this->lastResent);
  FIX::Message::Message(&this->sentLogon);
  FIX::Message::Message(&this->sentResendRequest);
  FIX::Message::Message(&this->sentHeartbeat);
  this->toLogon = 0;
  this->toResendRequest = 0;
  this->toHeartbeat = 0;
  this->toLogout = 0;
  this->toReject = 0;
  this->toSequenceReset = 0;
  this->toBusinessMessageReject = 0;
  this->fromHeartbeat = 0;
  this->fromTestRequest = 0;
  this->fromLogout = 0;
  this->fromReject = 0;
  this->fromSequenceReset = 0;
  this->resent = 0;
  this->disconnected = 0;
  this->checkForDoNotSend = 0;
  FIX::MemoryStoreFactory::MemoryStoreFactory(&this->factory);
  return;
}

Assistant:

TestCallback()
  : endTime( startTime ),
    toLogon( 0 ),
    toResendRequest( 0 ),
    toHeartbeat( 0 ),
    toLogout( 0 ),
    toReject( 0 ),
    toSequenceReset( 0 ),
    toBusinessMessageReject( 0 ),
    fromHeartbeat( 0 ),
    fromTestRequest( 0 ),
    fromLogout( 0 ),
    fromReject( 0 ),
    fromSequenceReset( 0 ),
    resent( 0 ),
    disconnected( 0 )
    {}